

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBQuantizeRow_C(uint8_t *dst_argb,int scale,int interval_size,int interval_offset,int width)

{
  char cVar1;
  char cVar2;
  int r;
  int g;
  int b;
  int x;
  int width_local;
  int interval_offset_local;
  int interval_size_local;
  int scale_local;
  uint8_t *dst_argb_local;
  
  dst_argb_local = dst_argb;
  for (x = 0; x < width; x = x + 1) {
    cVar2 = (char)interval_size;
    cVar1 = (char)interval_offset;
    *dst_argb_local = (char)((uint)*dst_argb_local * scale >> 0x10) * cVar2 + cVar1;
    dst_argb_local[1] = (char)((uint)dst_argb_local[1] * scale >> 0x10) * cVar2 + cVar1;
    dst_argb_local[2] = (char)((uint)dst_argb_local[2] * scale >> 0x10) * cVar2 + cVar1;
    dst_argb_local = dst_argb_local + 4;
  }
  return;
}

Assistant:

void ARGBQuantizeRow_C(uint8_t* dst_argb,
                       int scale,
                       int interval_size,
                       int interval_offset,
                       int width) {
  int x;
  for (x = 0; x < width; ++x) {
    int b = dst_argb[0];
    int g = dst_argb[1];
    int r = dst_argb[2];
    dst_argb[0] = (b * scale >> 16) * interval_size + interval_offset;
    dst_argb[1] = (g * scale >> 16) * interval_size + interval_offset;
    dst_argb[2] = (r * scale >> 16) * interval_size + interval_offset;
    dst_argb += 4;
  }
}